

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::ReleaseTemporaryGuestAllocator
          (ThreadContext *this,TempGuestArenaAllocatorObject *tempGuestAllocator)

{
  RecyclableData *pRVar1;
  Type *addr;
  
  if (this->temporaryGuestArenaAllocatorCount < 5) {
    Js::TempArenaAllocatorWrapper<true>::AdviseNotInUse(tempGuestAllocator);
    pRVar1 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->
                       (&this->recyclableData);
    addr = pRVar1->temporaryGuestArenaAllocators + this->temporaryGuestArenaAllocatorCount;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = tempGuestAllocator;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this->temporaryGuestArenaAllocatorCount = this->temporaryGuestArenaAllocatorCount + 1;
    return;
  }
  Js::TempArenaAllocatorWrapper<true>::Dispose(tempGuestAllocator,false);
  return;
}

Assistant:

void
ThreadContext::ReleaseTemporaryGuestAllocator(Js::TempGuestArenaAllocatorObject * tempGuestAllocator)
{
    if (temporaryGuestArenaAllocatorCount < MaxTemporaryArenaAllocators)
    {
        tempGuestAllocator->AdviseNotInUse();
        recyclableData->temporaryGuestArenaAllocators[temporaryGuestArenaAllocatorCount] = tempGuestAllocator;
        temporaryGuestArenaAllocatorCount++;
        return;
    }

    tempGuestAllocator->Dispose(false);
}